

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall node_socks::~node_socks(node_socks *this)

{
  bool bVar1;
  string *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                          (char *)in_RDI);
  if (bVar1) {
    if (*(int *)(in_RDI + 0x20) != -1) {
      close(*(int *)(in_RDI + 0x20));
    }
    if (*(int *)(in_RDI + 0x24) != -1) {
      close(*(int *)(in_RDI + 0x24));
    }
    if (*(int *)(in_RDI + 0x28) != -1) {
      close(*(int *)(in_RDI + 0x28));
    }
  }
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~node_socks()
  {
    if (current_master != "")
    {
      if (parent != -1)
        CLOSESOCK(this->parent);
      if (children[0] != -1)
        CLOSESOCK(this->children[0]);
      if (children[1] != -1)
        CLOSESOCK(this->children[1]);
    }
  }